

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMerge.c
# Opt level: O3

void Abc_NtkCollectOverlapCands(Abc_Obj_t *pLut,Vec_Ptr_t *vCands,Nwk_LMPars_t *pPars)

{
  uint *puVar1;
  Abc_Ntk_t *pAVar2;
  long *plVar3;
  Abc_Obj_t *pCand;
  Abc_Ntk_t *pAVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int *__s;
  void **ppvVar9;
  uint uVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar11;
  Nwk_LMPars_t *pNVar12;
  ulong uVar13;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  int iVar14;
  long lVar15;
  
  pNVar12 = pPars;
  if (0 < (pLut->vFanins).nSize) {
    lVar8 = 0;
    do {
      pNVar12 = (Nwk_LMPars_t *)(long)(pLut->vFanins).pArray[lVar8];
      puVar1 = (uint *)((long)pLut->pNtk->vObjs->pArray[(long)pNVar12] + 0x14);
      *puVar1 = *puVar1 | 0x40;
      lVar8 = lVar8 + 1;
    } while (lVar8 < (pLut->vFanins).nSize);
  }
  iVar7 = (int)pNVar12;
  vCands->nSize = 0;
  pAVar2 = pLut->pNtk;
  if ((pAVar2->vTravIds).pArray == (int *)0x0) {
    iVar11 = pAVar2->vObjs->nSize;
    uVar13 = (long)iVar11 + 500;
    iVar14 = (int)uVar13;
    if ((pAVar2->vTravIds).nCap < iVar14) {
      __s = (int *)malloc(uVar13 * 4);
      (pAVar2->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar2->vTravIds).nCap = iVar14;
      iVar7 = extraout_EDX;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar11) {
      memset(__s,0,(uVar13 & 0xffffffff) << 2);
      iVar7 = extraout_EDX_00;
    }
    (pAVar2->vTravIds).nSize = iVar14;
  }
  iVar14 = pAVar2->nTravIds;
  iVar11 = iVar14 + 1;
  pAVar2->nTravIds = iVar11;
  if (0x3ffffffe < iVar14) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  iVar14 = pLut->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar14 + 1,iVar7);
  if ((-1 < (long)iVar14) && (iVar14 < (pAVar2->vTravIds).nSize)) {
    (pAVar2->vTravIds).pArray[iVar14] = iVar11;
    iVar7 = (pLut->vFanins).nSize;
    if (0 < iVar7) {
      lVar8 = 0;
      do {
        plVar3 = (long *)pLut->pNtk->vObjs->pArray[(pLut->vFanins).pArray[lVar8]];
        if (((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7) &&
           (iVar11 = *(int *)((long)plVar3 + 0x2c), bVar5 = pPars->nMaxFanout < iVar11,
           uVar13 = CONCAT71((int7)((ulong)pPars >> 8),bVar5), 0 < iVar11 && !bVar5)) {
          lVar15 = 0;
          do {
            pCand = *(Abc_Obj_t **)
                     (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                     (long)*(int *)(plVar3[6] + lVar15 * 4) * 8);
            if ((*(uint *)&pCand->field_0x14 & 0xf) == 7) {
              pAVar2 = pCand->pNtk;
              iVar7 = pCand->Id;
              Vec_IntFillExtra(&pAVar2->vTravIds,iVar7 + 1,(int)uVar13);
              if (((long)iVar7 < 0) || ((pAVar2->vTravIds).nSize <= iVar7)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              pAVar4 = pCand->pNtk;
              iVar11 = pAVar4->nTravIds;
              uVar13 = extraout_RDX;
              if ((pAVar2->vTravIds).pArray[iVar7] != iVar11) {
                iVar7 = pCand->Id;
                Vec_IntFillExtra(&pAVar4->vTravIds,iVar7 + 1,(int)extraout_RDX);
                if (((long)iVar7 < 0) || ((pAVar4->vTravIds).nSize <= iVar7)) goto LAB_002de7d2;
                (pAVar4->vTravIds).pArray[iVar7] = iVar11;
                uVar6 = *(uint *)&pLut->field_0x14 >> 0xc;
                uVar10 = *(uint *)&pCand->field_0x14 >> 0xc;
                iVar11 = uVar6 - uVar10;
                iVar7 = pPars->nMaxLevelDiff;
                uVar13 = (ulong)CONCAT31((int3)((uint)iVar11 >> 8),iVar7 < iVar11);
                if ((int)(uVar10 - uVar6) <= iVar7 && iVar7 >= iVar11) {
                  iVar7 = Abc_NtkCountTotalFanins(pLut,pCand);
                  uVar13 = extraout_RDX_00;
                  if (iVar7 <= pPars->nMaxSuppSize) {
                    uVar6 = vCands->nSize;
                    if (uVar6 == vCands->nCap) {
                      if ((int)uVar6 < 0x10) {
                        if (vCands->pArray == (void **)0x0) {
                          ppvVar9 = (void **)malloc(0x80);
                        }
                        else {
                          ppvVar9 = (void **)realloc(vCands->pArray,0x80);
                        }
                        vCands->pArray = ppvVar9;
                        vCands->nCap = 0x10;
                      }
                      else {
                        if (vCands->pArray == (void **)0x0) {
                          ppvVar9 = (void **)malloc((ulong)uVar6 << 4);
                        }
                        else {
                          ppvVar9 = (void **)realloc(vCands->pArray,(ulong)uVar6 << 4);
                        }
                        vCands->pArray = ppvVar9;
                        vCands->nCap = uVar6 * 2;
                      }
                    }
                    else {
                      ppvVar9 = vCands->pArray;
                    }
                    iVar7 = vCands->nSize;
                    uVar6 = iVar7 + 1;
                    uVar13 = (ulong)uVar6;
                    vCands->nSize = uVar6;
                    ppvVar9[iVar7] = pCand;
                  }
                }
              }
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < *(int *)((long)plVar3 + 0x2c));
          iVar7 = (pLut->vFanins).nSize;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar7);
      if (0 < iVar7) {
        lVar8 = 0;
        do {
          puVar1 = (uint *)((long)pLut->pNtk->vObjs->pArray[(pLut->vFanins).pArray[lVar8]] + 0x14);
          *puVar1 = *puVar1 & 0xffffffbf;
          lVar8 = lVar8 + 1;
        } while (lVar8 < (pLut->vFanins).nSize);
      }
    }
    return;
  }
LAB_002de7d2:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Abc_NtkCollectOverlapCands( Abc_Obj_t * pLut, Vec_Ptr_t * vCands, Nwk_LMPars_t * pPars )
{
    Abc_Obj_t * pFanin, * pObj;
    int i, k;
    // mark fanins of pLut
    Abc_ObjForEachFanin( pLut, pFanin, i )
        pFanin->fMarkC = 1;
    // collect the matching fanouts of each fanin of the node
    Vec_PtrClear( vCands );
    Abc_NtkIncrementTravId( pLut->pNtk );
    Abc_NodeSetTravIdCurrent( pLut );
    Abc_ObjForEachFanin( pLut, pFanin, i )
    {
        if ( !Abc_ObjIsNode(pFanin) )
            continue;
        if ( Abc_ObjFanoutNum(pFanin) > pPars->nMaxFanout )
            continue;
        Abc_ObjForEachFanout( pFanin, pObj, k )
        {
            if ( !Abc_ObjIsNode(pObj) )
                continue;
            if ( Abc_NodeIsTravIdCurrent( pObj ) )
                continue;
            Abc_NodeSetTravIdCurrent( pObj );
            // check the difference in delay
            if ( Abc_ObjLevel(pLut) - Abc_ObjLevel(pObj) > pPars->nMaxLevelDiff || 
                 Abc_ObjLevel(pObj) - Abc_ObjLevel(pLut) > pPars->nMaxLevelDiff )
                 continue;
            // check the total number of fanins of the node
            if ( Abc_NtkCountTotalFanins(pLut, pObj) > pPars->nMaxSuppSize )
                continue;
            Vec_PtrPush( vCands, pObj );
        }
    }
    // unmark fanins of pLut
    Abc_ObjForEachFanin( pLut, pFanin, i )
        pFanin->fMarkC = 0;
}